

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint32_t auStack_198 [10];
  undefined8 uStack_170;
  uint local_160;
  uint local_15c;
  uint auStack_158 [9];
  uint32_t auStack_134 [5];
  uint auStack_120 [8];
  uint32_t auStack_100 [42];
  uint local_58 [8];
  mbedtls_sha256_context *local_38;
  
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    auStack_198[lVar4 + 0x50] = ctx->state[lVar4];
  }
  for (lVar4 = 2; lVar4 != 0x12; lVar4 = lVar4 + 1) {
    uVar1 = *(uint *)(data + lVar4 * 4 + -8);
    auStack_198[lVar4 + 0xe] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (uVar9 = 0; uVar9 < 0x10; uVar9 = uVar9 + 8) {
    iVar10 = ((local_58[4] << 7 | local_58[4] >> 0x19) ^
             (local_58[4] << 0x15 | local_58[4] >> 0xb) ^ (local_58[4] << 0x1a | local_58[4] >> 6))
             + local_58[7] + K[uVar9] + auStack_198[uVar9 + 0x10] +
             ((local_58[5] ^ local_58[6]) & local_58[4] ^ local_58[6]);
    local_58[3] = local_58[3] + iVar10;
    local_58[7] = ((local_58[1] | local_58[0]) & local_58[2] | local_58[1] & local_58[0]) +
                  ((local_58[0] << 10 | local_58[0] >> 0x16) ^
                  (local_58[0] << 0x13 | local_58[0] >> 0xd) ^
                  (local_58[0] << 0x1e | local_58[0] >> 2)) + iVar10;
    iVar10 = ((local_58[5] ^ local_58[4]) & local_58[3] ^ local_58[5]) + local_58[6] + K[uVar9 + 1]
             + ((local_58[3] * 0x80 | local_58[3] >> 0x19) ^
               (local_58[3] * 0x200000 | local_58[3] >> 0xb) ^
               (local_58[3] * 0x4000000 | local_58[3] >> 6)) + auStack_198[uVar9 + 0x11];
    local_58[2] = local_58[2] + iVar10;
    local_58[6] = ((local_58[7] | local_58[0]) & local_58[1] | local_58[7] & local_58[0]) +
                  ((local_58[7] * 0x400 | local_58[7] >> 0x16) ^
                  (local_58[7] * 0x80000 | local_58[7] >> 0xd) ^
                  (local_58[7] * 0x40000000 | local_58[7] >> 2)) + iVar10;
    iVar10 = local_58[5] + K[uVar9 + 2] + auStack_198[uVar9 + 0x12] +
             ((local_58[3] ^ local_58[4]) & local_58[2] ^ local_58[4]) +
             ((local_58[2] * 0x80 | local_58[2] >> 0x19) ^
             (local_58[2] * 0x200000 | local_58[2] >> 0xb) ^
             (local_58[2] * 0x4000000 | local_58[2] >> 6));
    local_58[1] = local_58[1] + iVar10;
    local_58[5] = ((local_58[6] | local_58[7]) & local_58[0] | local_58[6] & local_58[7]) +
                  ((local_58[6] * 0x400 | local_58[6] >> 0x16) ^
                  (local_58[6] * 0x80000 | local_58[6] >> 0xd) ^
                  (local_58[6] * 0x40000000 | local_58[6] >> 2)) + iVar10;
    iVar10 = local_58[4] + K[uVar9 + 3] + auStack_198[uVar9 + 0x13] +
             ((local_58[2] ^ local_58[3]) & local_58[1] ^ local_58[3]) +
             ((local_58[1] * 0x80 | local_58[1] >> 0x19) ^
             (local_58[1] * 0x200000 | local_58[1] >> 0xb) ^
             (local_58[1] * 0x4000000 | local_58[1] >> 6));
    local_58[0] = local_58[0] + iVar10;
    local_58[4] = ((local_58[5] | local_58[6]) & local_58[7] | local_58[5] & local_58[6]) +
                  ((local_58[5] * 0x400 | local_58[5] >> 0x16) ^
                  (local_58[5] * 0x80000 | local_58[5] >> 0xd) ^
                  (local_58[5] * 0x40000000 | local_58[5] >> 2)) + iVar10;
    iVar10 = local_58[3] + K[uVar9 + 4] + auStack_198[uVar9 + 0x14] +
             ((local_58[1] ^ local_58[2]) & local_58[0] ^ local_58[2]) +
             ((local_58[0] * 0x80 | local_58[0] >> 0x19) ^
             (local_58[0] * 0x200000 | local_58[0] >> 0xb) ^
             (local_58[0] * 0x4000000 | local_58[0] >> 6));
    local_58[7] = local_58[7] + iVar10;
    local_58[3] = iVar10 + ((local_58[4] | local_58[5]) & local_58[6] | local_58[4] & local_58[5]) +
                           ((local_58[4] * 0x400 | local_58[4] >> 0x16) ^
                           (local_58[4] * 0x80000 | local_58[4] >> 0xd) ^
                           (local_58[4] * 0x40000000 | local_58[4] >> 2));
    iVar10 = local_58[2] + K[uVar9 + 5] + auStack_198[uVar9 + 0x15] +
             ((local_58[0] ^ local_58[1]) & local_58[7] ^ local_58[1]) +
             ((local_58[7] * 0x80 | local_58[7] >> 0x19) ^
             (local_58[7] * 0x200000 | local_58[7] >> 0xb) ^
             (local_58[7] * 0x4000000 | local_58[7] >> 6));
    local_58[6] = local_58[6] + iVar10;
    local_58[2] = iVar10 + ((local_58[3] | local_58[4]) & local_58[5] | local_58[3] & local_58[4]) +
                           ((local_58[3] * 0x400 | local_58[3] >> 0x16) ^
                           (local_58[3] * 0x80000 | local_58[3] >> 0xd) ^
                           (local_58[3] * 0x40000000 | local_58[3] >> 2));
    iVar10 = local_58[1] + K[uVar9 + 6] + auStack_198[uVar9 + 0x16] +
             ((local_58[7] ^ local_58[0]) & local_58[6] ^ local_58[0]) +
             ((local_58[6] * 0x80 | local_58[6] >> 0x19) ^
             (local_58[6] * 0x200000 | local_58[6] >> 0xb) ^
             (local_58[6] * 0x4000000 | local_58[6] >> 6));
    local_58[5] = local_58[5] + iVar10;
    local_58[1] = iVar10 + ((local_58[2] | local_58[3]) & local_58[4] | local_58[2] & local_58[3]) +
                           ((local_58[2] * 0x400 | local_58[2] >> 0x16) ^
                           (local_58[2] * 0x80000 | local_58[2] >> 0xd) ^
                           (local_58[2] * 0x40000000 | local_58[2] >> 2));
    iVar10 = local_58[0] + K[uVar9 + 7] + auStack_198[uVar9 + 0x17] +
             ((local_58[6] ^ local_58[7]) & local_58[5] ^ local_58[7]) +
             ((local_58[5] * 0x80 | local_58[5] >> 0x19) ^
             (local_58[5] * 0x200000 | local_58[5] >> 0xb) ^
             (local_58[5] * 0x4000000 | local_58[5] >> 6));
    local_58[4] = local_58[4] + iVar10;
    local_58[0] = iVar10 + ((local_58[1] | local_58[2]) & local_58[3] | local_58[1] & local_58[2]) +
                           ((local_58[1] * 0x400 | local_58[1] >> 0x16) ^
                           (local_58[1] * 0x80000 | local_58[1] >> 0xd) ^
                           (local_58[1] * 0x40000000 | local_58[1] >> 2));
  }
  local_15c = local_58[6];
  local_160 = local_58[2];
  for (uVar9 = 0x10; uVar9 < 0x40; uVar9 = uVar9 + 8) {
    uVar1 = auStack_198[uVar9 + 1];
    uVar2 = auStack_198[uVar9 + 0xe];
    uVar3 = (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
            auStack_198[uVar9 + 9] + auStack_198[uVar9] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    auStack_198[uVar9 + 0x10] = uVar3;
    iVar10 = ((local_58[4] << 7 | local_58[4] >> 0x19) ^
             (local_58[4] << 0x15 | local_58[4] >> 0xb) ^ (local_58[4] << 0x1a | local_58[4] >> 6))
             + local_58[7] + K[uVar9] + ((local_58[5] ^ local_58[6]) & local_58[4] ^ local_58[6]) +
             uVar3;
    local_58[7] = ((local_58[1] | local_58[0]) & local_58[2] | local_58[1] & local_58[0]) +
                  ((local_58[0] << 10 | local_58[0] >> 0x16) ^
                  (local_58[0] << 0x13 | local_58[0] >> 0xd) ^
                  (local_58[0] << 0x1e | local_58[0] >> 2)) + iVar10;
    uVar5 = iVar10 + local_58[3];
    local_58[3] = uVar5;
    uVar1 = auStack_198[uVar9 + 0xf];
    uVar2 = auStack_198[uVar9 + 2];
    uVar3 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_198[uVar9 + 10] + auStack_198[uVar9 + 1] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    auStack_198[uVar9 + 0x11] = uVar3;
    iVar10 = uVar3 + ((local_58[4] ^ local_58[5]) & uVar5 ^ local_58[5]) +
             ((uVar5 * 0x80 | uVar5 >> 0x19) ^
             (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + local_58[6] +
             K[uVar9 + 1];
    local_58[6] = ((local_58[0] | local_58[7]) & local_58[1] | local_58[0] & local_58[7]) +
                  ((local_58[7] * 0x400 | local_58[7] >> 0x16) ^
                  (local_58[7] * 0x80000 | local_58[7] >> 0xd) ^
                  (local_58[7] * 0x40000000 | local_58[7] >> 2)) + iVar10;
    uVar8 = iVar10 + local_58[2];
    local_58[2] = uVar8;
    uVar1 = auStack_198[uVar9 + 3];
    uVar2 = auStack_198[uVar9 + 0x10];
    uVar3 = (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
            auStack_198[uVar9 + 0xb] + auStack_198[uVar9 + 2] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    auStack_198[uVar9 + 0x12] = uVar3;
    iVar10 = uVar3 + ((uVar5 ^ local_58[4]) & uVar8 ^ local_58[4]) +
             ((uVar8 * 0x80 | uVar8 >> 0x19) ^
             (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6)) + local_58[5] +
             K[uVar9 + 2];
    local_58[5] = ((local_58[7] | local_58[6]) & local_58[0] | local_58[7] & local_58[6]) +
                  ((local_58[6] * 0x400 | local_58[6] >> 0x16) ^
                  (local_58[6] * 0x80000 | local_58[6] >> 0xd) ^
                  (local_58[6] * 0x40000000 | local_58[6] >> 2)) + iVar10;
    uVar6 = iVar10 + local_58[1];
    local_58[1] = uVar6;
    uVar1 = auStack_198[uVar9 + 0x11];
    uVar2 = auStack_198[uVar9 + 4];
    uVar3 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_198[uVar9 + 0xc] + auStack_198[uVar9 + 3] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    auStack_198[uVar9 + 0x13] = uVar3;
    iVar10 = uVar3 + ((uVar8 ^ uVar5) & uVar6 ^ uVar5) +
             ((uVar6 * 0x80 | uVar6 >> 0x19) ^
             (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) + local_58[4] +
             K[uVar9 + 3];
    local_58[4] = ((local_58[6] | local_58[5]) & local_58[7] | local_58[6] & local_58[5]) +
                  ((local_58[5] * 0x400 | local_58[5] >> 0x16) ^
                  (local_58[5] * 0x80000 | local_58[5] >> 0xd) ^
                  (local_58[5] * 0x40000000 | local_58[5] >> 2)) + iVar10;
    uVar6 = iVar10 + local_58[0];
    local_58[0] = uVar6;
    uVar1 = auStack_198[uVar9 + 0x12];
    uVar2 = auStack_198[uVar9 + 5];
    uVar8 = (local_58[1] ^ local_58[2]) & uVar6 ^ local_58[2];
    uVar7 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_198[uVar9 + 0xd] + auStack_198[uVar9 + 4] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    uVar3 = K[uVar9 + 4];
    auStack_198[uVar9 + 0x14] = uVar7;
    iVar10 = uVar7 + uVar8 +
             ((uVar6 * 0x80 | uVar6 >> 0x19) ^
             (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) + uVar5 + uVar3;
    local_58[7] = iVar10 + local_58[7];
    local_58[3] = ((local_58[5] | local_58[4]) & local_58[6] | local_58[5] & local_58[4]) +
                  ((local_58[4] * 0x400 | local_58[4] >> 0x16) ^
                  (local_58[4] * 0x80000 | local_58[4] >> 0xd) ^
                  (local_58[4] * 0x40000000 | local_58[4] >> 2)) + iVar10;
    uVar1 = auStack_198[uVar9 + 0x13];
    uVar2 = auStack_198[uVar9 + 6];
    uVar5 = (local_58[0] ^ local_58[1]) & local_58[7] ^ local_58[1];
    uVar3 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_198[uVar9 + 0xe] + auStack_198[uVar9 + 5] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    auStack_198[uVar9 + 0x15] = uVar3;
    iVar10 = uVar3 + uVar5 +
             ((local_58[7] * 0x80 | local_58[7] >> 0x19) ^
             (local_58[7] * 0x200000 | local_58[7] >> 0xb) ^
             (local_58[7] * 0x4000000 | local_58[7] >> 6)) + local_58[2] + K[uVar9 + 5];
    uVar6 = iVar10 + local_58[6];
    local_58[6] = uVar6;
    local_58[2] = ((local_58[4] | local_58[3]) & local_58[5] | local_58[4] & local_58[3]) +
                  ((local_58[3] << 10 | local_58[3] >> 0x16) ^
                  (local_58[3] << 0x13 | local_58[3] >> 0xd) ^
                  (local_58[3] << 0x1e | local_58[3] >> 2)) + iVar10;
    uVar5 = (local_58[7] ^ local_58[0]) & uVar6 ^ local_58[0];
    uVar1 = auStack_198[uVar9 + 7];
    uVar2 = auStack_198[uVar9 + 0x14];
    uVar3 = (uVar2 >> 10 ^ (uVar2 << 0xd | uVar2 >> 0x13) ^ (uVar2 << 0xf | uVar2 >> 0x11)) +
            auStack_198[uVar9 + 0xf] + auStack_198[uVar9 + 6] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    auStack_198[uVar9 + 0x16] = uVar3;
    iVar10 = uVar3 + uVar5 +
             ((uVar6 * 0x80 | uVar6 >> 0x19) ^
             (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6)) + local_58[1] +
             K[uVar9 + 6];
    uVar5 = iVar10 + local_58[5];
    local_58[5] = uVar5;
    local_58[1] = ((local_58[3] | local_58[2]) & local_58[4] | local_58[3] & local_58[2]) +
                  ((local_58[2] << 10 | local_58[2] >> 0x16) ^
                  (local_58[2] << 0x13 | local_58[2] >> 0xd) ^
                  (local_58[2] << 0x1e | local_58[2] >> 2)) + iVar10;
    uVar1 = auStack_198[uVar9 + 0x15];
    uVar2 = auStack_198[uVar9 + 8];
    uVar3 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
            auStack_198[uVar9 + 0x10] + auStack_198[uVar9 + 7] +
            (uVar2 >> 3 ^ (uVar2 << 0xe | uVar2 >> 0x12) ^ (uVar2 << 0x19 | uVar2 >> 7));
    auStack_198[uVar9 + 0x17] = uVar3;
    local_160 = uVar3 + ((uVar6 ^ local_58[7]) & uVar5 ^ local_58[7]) +
                ((uVar5 * 0x80 | uVar5 >> 0x19) ^
                (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + local_58[0]
                + K[uVar9 + 7];
    local_15c = ((local_58[2] | local_58[1]) & local_58[3] | local_58[2] & local_58[1]) +
                ((local_58[1] << 10 | local_58[1] >> 0x16) ^
                (local_58[1] << 0x13 | local_58[1] >> 0xd) ^
                (local_58[1] << 0x1e | local_58[1] >> 2));
    local_58[4] = local_58[4] + local_160;
    local_58[0] = local_15c + local_160;
  }
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    ctx->state[lVar4] = ctx->state[lVar4] + auStack_198[lVar4 + 0x50];
  }
  uStack_170 = 0x1b839c5;
  local_38 = ctx;
  mbedtls_platform_zeroize(auStack_198 + 0xe,0x128);
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process_c(mbedtls_sha256_context *ctx,
                                      const unsigned char data[SHA256_BLOCK_SIZE])
{
    struct {
        uint32_t temp1, temp2, W[64];
        uint32_t A[8];
    } local;

    unsigned int i;

    for (i = 0; i < 8; i++) {
        local.A[i] = ctx->state[i];
    }

#if defined(MBEDTLS_SHA256_SMALLER)
    for (i = 0; i < 64; i++) {
        if (i < 16) {
            local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
        } else {
            R(i);
        }

        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i], K[i]);

        local.temp1 = local.A[7]; local.A[7] = local.A[6];
        local.A[6] = local.A[5]; local.A[5] = local.A[4];
        local.A[4] = local.A[3]; local.A[3] = local.A[2];
        local.A[2] = local.A[1]; local.A[1] = local.A[0];
        local.A[0] = local.temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for (i = 0; i < 16; i++) {
        local.W[i] = MBEDTLS_GET_UINT32_BE(data, 4 * i);
    }

    for (i = 0; i < 16; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], local.W[i+0], K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], local.W[i+1], K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], local.W[i+2], K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], local.W[i+3], K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], local.W[i+4], K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], local.W[i+5], K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], local.W[i+6], K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], local.W[i+7], K[i+7]);
    }

    for (i = 16; i < 64; i += 8) {
        P(local.A[0], local.A[1], local.A[2], local.A[3], local.A[4],
          local.A[5], local.A[6], local.A[7], R(i+0), K[i+0]);
        P(local.A[7], local.A[0], local.A[1], local.A[2], local.A[3],
          local.A[4], local.A[5], local.A[6], R(i+1), K[i+1]);
        P(local.A[6], local.A[7], local.A[0], local.A[1], local.A[2],
          local.A[3], local.A[4], local.A[5], R(i+2), K[i+2]);
        P(local.A[5], local.A[6], local.A[7], local.A[0], local.A[1],
          local.A[2], local.A[3], local.A[4], R(i+3), K[i+3]);
        P(local.A[4], local.A[5], local.A[6], local.A[7], local.A[0],
          local.A[1], local.A[2], local.A[3], R(i+4), K[i+4]);
        P(local.A[3], local.A[4], local.A[5], local.A[6], local.A[7],
          local.A[0], local.A[1], local.A[2], R(i+5), K[i+5]);
        P(local.A[2], local.A[3], local.A[4], local.A[5], local.A[6],
          local.A[7], local.A[0], local.A[1], R(i+6), K[i+6]);
        P(local.A[1], local.A[2], local.A[3], local.A[4], local.A[5],
          local.A[6], local.A[7], local.A[0], R(i+7), K[i+7]);
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for (i = 0; i < 8; i++) {
        ctx->state[i] += local.A[i];
    }

    /* Zeroise buffers and variables to clear sensitive data from memory. */
    mbedtls_platform_zeroize(&local, sizeof(local));

    return 0;
}